

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QPointF __thiscall QGraphicsView::mapToScene(QGraphicsView *this,QPoint *point)

{
  int iVar1;
  int iVar2;
  QGraphicsViewPrivate *this_00;
  qint64 qVar3;
  long in_FS_OFFSET;
  double dVar4;
  QPointF QVar5;
  double local_88;
  QPointF local_68 [5];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  iVar1 = (point->xp).m_i;
  iVar2 = (point->yp).m_i;
  qVar3 = QGraphicsViewPrivate::horizontalScroll(this_00);
  local_88 = (double)qVar3 + (double)iVar1;
  qVar3 = QGraphicsViewPrivate::verticalScroll(this_00);
  dVar4 = (double)qVar3 + (double)iVar2;
  if ((this_00->field_0x300 & 0x10) == 0) {
    QTransform::inverted((bool *)local_68);
    local_88 = (double)QTransform::map(local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar5.yp = dVar4;
    QVar5.xp = local_88;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsView::mapToScene(const QPoint &point) const
{
    Q_D(const QGraphicsView);
    QPointF p = point;
    p.rx() += d->horizontalScroll();
    p.ry() += d->verticalScroll();
    return d->identityMatrix ? p : d->matrix.inverted().map(p);
}